

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Index __thiscall
wasm::OptimizeInstructions::getSignExtBits(OptimizeInstructions *this,Expression *curr)

{
  bool bVar1;
  Id IVar2;
  Index IVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> pEVar4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_108;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_c8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_88;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_60;
  undefined8 local_50;
  undefined4 local_48;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_40;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_28;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  IVar2 = curr->_id;
  if ((curr->type).id == 2) {
    if (IVar2 == UnaryId) {
      if (1 < *(int *)(curr + 1) - 0x2fU) {
        return 0;
      }
      pEVar4 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)curr[1].type.id;
    }
    else {
      local_108.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
      extended._0_4_ = 0;
      local_c8.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
      extended._4_4_ = 0;
      local_60.binder = &local_28;
      local_28 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
      local_88.submatchers.curr = &local_60;
      local_88.submatchers.next.curr = &local_108;
      local_108.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_108.binder = (matched_t<wasm::Const_*> *)0x0;
      local_40.curr = &local_88;
      local_88.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_88.data = ShlInt32;
      local_40.next.curr = &local_c8;
      local_c8.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_c8.binder = (matched_t<wasm::Const_*> *)0x0;
      local_50 = 0;
      local_48 = 0xb;
      if ((((IVar2 != BinaryId) || (*(int *)(curr + 1) != 0xb)) ||
          (bVar1 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                            )curr,&local_40), !bVar1)) ||
         (((int)extended != extended._4_4_ || (pEVar4 = local_28, (int)extended == 0)))) {
        pEVar4 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
      }
    }
    if (pEVar4 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0) {
      IVar3 = Properties::getSignExtBits(curr);
      return IVar3;
    }
    IVar2 = curr->_id;
  }
  if (IVar2 != LocalGetId) {
    return 0;
  }
  return (this->localInfo).super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>.
         _M_impl.super__Vector_impl_data._M_start[*(uint *)(curr + 1)].signExtBits;
}

Assistant:

Index getSignExtBits(Expression* curr) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr);
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // Check what we know about the local.
      return localInfo[get->index].signExtBits;
    }
    return 0;
  }